

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O2

int mem_iraf_open(char *filename,int rwmode,int *hdl)

{
  int iVar1;
  int status;
  size_t filesize;
  int local_34;
  size_t local_30;
  
  local_30 = 0;
  iVar1 = mem_createmem(0,hdl);
  local_34 = iVar1;
  if (iVar1 == 0) {
    local_34 = iraf2mem(filename,memTable[*hdl].memaddrptr,memTable[*hdl].memsizeptr,&local_30,
                        &local_34);
    iVar1 = *hdl;
    if (local_34 == 0) {
      memTable[iVar1].currentpos = 0;
      memTable[iVar1].fitsfilesize = local_30;
      local_34 = 0;
    }
    else {
      mem_close_free(iVar1);
      ffpmsg("failed to convert IRAF file into memory (mem_iraf_open)");
    }
  }
  else {
    ffpmsg("failed to create empty memory file (mem_iraf_open)");
    local_34 = iVar1;
  }
  return local_34;
}

Assistant:

int mem_iraf_open(char *filename, int rwmode, int *hdl)
/*
  This routine creates an empty memory buffer, then calls iraf2mem to
  open the IRAF disk file and convert it to a FITS file in memeory.
*/
{
    int status;
    size_t filesize = 0;

    /* create a memory file with size = 0 for the FITS converted IRAF file */
    status = mem_createmem(filesize, hdl);
    if (status)
    {
        ffpmsg("failed to create empty memory file (mem_iraf_open)");
        return(status);
    }

    /* convert the iraf file into a FITS file in memory */
    status = iraf2mem(filename, memTable[*hdl].memaddrptr,
                      memTable[*hdl].memsizeptr, &filesize, &status);

    if (status)
    {
        mem_close_free(*hdl);   /* free up the memory */
        ffpmsg("failed to convert IRAF file into memory (mem_iraf_open)");
        return(status);
    }

    memTable[*hdl].currentpos = 0;           /* save starting position */
    memTable[*hdl].fitsfilesize=filesize;   /* and initial file size  */

    return(0);
}